

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cord.cc
# Opt level: O3

string_view __thiscall absl::lts_20250127::Cord::InlineRep::FindFlatStartPiece(InlineRep *this)

{
  size_t sVar1;
  string_view sVar2;
  int iVar3;
  ulong uVar4;
  byte bVar5;
  CordRep *pCVar6;
  CordRepBtree *this_00;
  string_view sVar7;
  
  uVar4 = (ulong)(this->data_).rep_.field_0.data[0];
  if ((uVar4 & 1) == 0) {
    sVar7._M_str = (char *)((long)&(this->data_).rep_.field_0 + 1);
    sVar7._M_len = uVar4 >> 1;
  }
  else {
    this_00 = (CordRepBtree *)(this->data_).rep_.field_0.as_tree.rep;
    if (this_00 == (CordRepBtree *)0x0) {
      __assert_fail("rep != nullptr",
                    "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/build_O3/_deps/absl-src/absl/strings/internal/cord_rep_crc.h"
                    ,0x48,"CordRep *absl::cord_internal::SkipCrcNode(CordRep *)");
    }
    bVar5 = (this_00->super_CordRep).tag;
    if (bVar5 == 2) {
      this_00 = (CordRepBtree *)this_00->edges_[0];
      bVar5 = (this_00->super_CordRep).tag;
    }
    if (bVar5 < 6) {
      if (bVar5 == 3) {
        iVar3 = (this_00->super_CordRep).storage[0] + 1;
        while (iVar3 + -1 != 0 && 0 < iVar3) {
          this_00 = (CordRepBtree *)this_00->edges_[(this_00->super_CordRep).storage[1]];
          iVar3 = iVar3 + -1;
          if ((this_00->super_CordRep).tag != '\x03') {
            __assert_fail("IsBtree()",
                          "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/build_O3/_deps/absl-src/absl/strings/internal/cord_rep_btree.h"
                          ,599,"CordRepBtree *absl::cord_internal::CordRep::btree()");
          }
        }
        sVar7 = cord_internal::CordRepBtree::Data
                          (this_00,(ulong)(this_00->super_CordRep).storage[1]);
      }
      else if (bVar5 == 5) {
        sVar7._M_str = (char *)this_00->edges_[0];
        sVar7._M_len = (this_00->super_CordRep).length;
      }
      else {
        sVar1 = (this_00->super_CordRep).length;
        if (sVar1 == 0) {
          __assert_fail("length != 0",
                        "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/build_O3/_deps/absl-src/absl/strings/cord.cc"
                        ,0x34b,"absl::string_view absl::Cord::InlineRep::FindFlatStartPiece() const"
                       );
        }
        if (bVar5 == 1) {
          pCVar6 = this_00->edges_[0];
          this_00 = (CordRepBtree *)this_00->edges_[1];
          bVar5 = (this_00->super_CordRep).tag;
          if (5 < bVar5) {
            if (bVar5 < 0xf9) {
              sVar2._M_str = (char *)(pCVar6->storage + (long)&this_00->super_CordRep);
              sVar2._M_len = sVar1;
              return sVar2;
            }
            goto LAB_0029514a;
          }
        }
        else {
          pCVar6 = (CordRep *)0x0;
        }
        if (bVar5 != 5) {
          __assert_fail("node->IsExternal() && \"Expect FLAT or EXTERNAL node here\"",
                        "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/build_O3/_deps/absl-src/absl/strings/cord.cc"
                        ,0x356,"absl::string_view absl::Cord::InlineRep::FindFlatStartPiece() const"
                       );
        }
        sVar7._M_str = (char *)(this_00->edges_[0]->storage + (long)(pCVar6->storage + -0x1a));
        sVar7._M_len = sVar1;
      }
    }
    else {
      if (0xf8 < bVar5) {
LAB_0029514a:
        __assert_fail("tag >= FLAT && tag <= MAX_FLAT_TAG",
                      "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/build_O3/_deps/absl-src/absl/strings/internal/cord_rep_flat.h"
                      ,0xb6,"CordRepFlat *absl::cord_internal::CordRep::flat()");
      }
      sVar7._M_str = (char *)(this_00->super_CordRep).storage;
      sVar7._M_len = (this_00->super_CordRep).length;
    }
  }
  return sVar7;
}

Assistant:

inline absl::string_view Cord::InlineRep::FindFlatStartPiece() const {
  if (!is_tree()) {
    return absl::string_view(data_.as_chars(), data_.inline_size());
  }

  CordRep* node = cord_internal::SkipCrcNode(tree());
  if (node->IsFlat()) {
    return absl::string_view(node->flat()->Data(), node->length);
  }

  if (node->IsExternal()) {
    return absl::string_view(node->external()->base, node->length);
  }

  if (node->IsBtree()) {
    CordRepBtree* tree = node->btree();
    int height = tree->height();
    while (--height >= 0) {
      tree = tree->Edge(CordRepBtree::kFront)->btree();
    }
    return tree->Data(tree->begin());
  }

  // Get the child node if we encounter a SUBSTRING.
  size_t offset = 0;
  size_t length = node->length;
  assert(length != 0);

  if (node->IsSubstring()) {
    offset = node->substring()->start;
    node = node->substring()->child;
  }

  if (node->IsFlat()) {
    return absl::string_view(node->flat()->Data() + offset, length);
  }

  assert(node->IsExternal() && "Expect FLAT or EXTERNAL node here");

  return absl::string_view(node->external()->base + offset, length);
}